

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

void Curl_hsts_cleanup(hsts **hp)

{
  hsts *phVar1;
  void **ppvVar2;
  stsentry *sts;
  Curl_llist_element *n;
  Curl_llist_element *e;
  hsts *h;
  hsts **hp_local;
  
  phVar1 = *hp;
  if (phVar1 != (hsts *)0x0) {
    n = (phVar1->list).head;
    while (n != (Curl_llist_element *)0x0) {
      ppvVar2 = &n->ptr;
      n = n->next;
      hsts_free((stsentry *)*ppvVar2);
    }
    (*Curl_cfree)(phVar1->filename);
    (*Curl_cfree)(phVar1);
    *hp = (hsts *)0x0;
  }
  return;
}

Assistant:

void Curl_hsts_cleanup(struct hsts **hp)
{
  struct hsts *h = *hp;
  if(h) {
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;
    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      hsts_free(sts);
    }
    free(h->filename);
    free(h);
    *hp = NULL;
  }
}